

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetAliases(cmGlobalNinjaGenerator *this,ostream *os)

{
  bool bVar1;
  _Base_ptr p_Var2;
  cmNinjaBuild build;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [64];
  pointer local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8 [6];
  
  WriteDivider(os);
  std::operator<<(os,"# Target aliases.\n\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"phony",&local_159);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
             (char (*) [1])0x4813ae);
  for (p_Var2 = (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(long *)(p_Var2 + 2) != 0) {
      bVar1 = HasCustomCommandOutput(this,(string *)(p_Var2 + 1));
      if (!bVar1) {
        std::__cxx11::string::_M_assign((string *)local_f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(local_c8);
        AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var2 + 2),local_c8,DependOnTargetArtifact
                           );
        WriteBuild(this,os,(cmNinjaBuild *)local_138,0,(bool *)0x0);
      }
    }
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_138);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetAliases(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Target aliases.\n\n";

  cmNinjaBuild build("phony");
  build.Outputs.emplace_back("");
  for (auto const& ta : TargetAliases) {
    // Don't write ambiguous aliases.
    if (!ta.second) {
      continue;
    }

    // Don't write alias if there is a already a custom command with
    // matching output
    if (this->HasCustomCommandOutput(ta.first)) {
      continue;
    }

    // Outputs
    build.Outputs[0] = ta.first;
    // Explicit depdendencies
    build.ExplicitDeps.clear();
    this->AppendTargetOutputs(ta.second, build.ExplicitDeps);
    // Write
    this->WriteBuild(os, build);
  }
}